

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

void TweakAnnotationPlane(ON_Plane *plane)

{
  ON_3dVector *this;
  ON_3dVector *this_00;
  ON_3dVector local_38;
  
  if (10000000000.0 < ABS((plane->origin).x)) {
    (plane->origin).x = 0.0;
  }
  if (10000000000.0 < ABS((plane->origin).y)) {
    (plane->origin).y = 0.0;
  }
  if (10000000000.0 < ABS((plane->origin).z)) {
    (plane->origin).z = 0.0;
  }
  this = &plane->xaxis;
  if (10000000000.0 < ABS((plane->xaxis).x)) {
    this->x = 1.0;
  }
  if (10000000000.0 < ABS((plane->xaxis).y)) {
    (plane->xaxis).y = 0.0;
  }
  if (10000000000.0 < ABS((plane->xaxis).z)) {
    (plane->xaxis).z = 0.0;
  }
  this_00 = &plane->yaxis;
  if (10000000000.0 < ABS((plane->yaxis).x)) {
    this_00->x = 0.0;
  }
  if (10000000000.0 < ABS((plane->yaxis).y)) {
    (plane->yaxis).y = 1.0;
  }
  if (10000000000.0 < ABS((plane->yaxis).z)) {
    (plane->yaxis).z = 0.0;
  }
  ON_3dVector::Unitize(this);
  ON_3dVector::Unitize(this_00);
  ON_CrossProduct(&local_38,this,this_00);
  (plane->zaxis).z = local_38.z;
  (plane->zaxis).x = local_38.x;
  (plane->zaxis).y = local_38.y;
  ON_3dVector::Unitize(&plane->zaxis);
  ON_Plane::UpdateEquation(plane);
  return;
}

Assistant:

static
void TweakAnnotationPlane( ON_Plane& plane )
{
  // 10 November 2003 Dale Lear
  //   Fixed lots of bugs in annotation plane tweaking.
  //   Before the fix this block of code was cut-n-pasted 
  //   in three places.  The fabs() calls were wrong.  In addition
  //   and the
  //   .x values where tested and then the .y/.z values were set.

  //    if( fabs( plane.origin.x > 1e10 ))
  //      plane.origin.x = 0.0;
  //    if( fabs( plane.origin.y > 1e10 ))
  //      plane.origin.y = 0.0;
  //    if( fabs( plane.origin.z > 1e10 ))
  //      plane.origin.z = 0.0;
  //    
  //    if( fabs( plane.xaxis.x > 1e10 ))
  //      plane.xaxis.x = 1.0;
  //    if( fabs( plane.xaxis.x > 1e10 ))
  //      plane.xaxis.y = 0.0;
  //    if( fabs( plane.xaxis.x > 1e10 ))
  //      plane.xaxis.z = 0.0;
  //    
  //    if( fabs( plane.yaxis.x > 1e10 ))
  //      plane.yaxis.x = 0.0;
  //    if( fabs( plane.yaxis.x > 1e10 ))
  //      plane.yaxis.y = 1.0;
  //    if( fabs( plane.yaxis.x > 1e10 ))
  //      plane.yaxis.z = 0.0;

  // Lowell has decided that annotation plane
  // coordinates bigger than "too_big" should be
  // set to zero.
  const double too_big = 1.0e10;

  if( fabs( plane.origin.x ) > too_big )
    plane.origin.x = 0.0;
  if( fabs( plane.origin.y ) > too_big )
    plane.origin.y = 0.0;
  if( fabs( plane.origin.z ) > too_big )
    plane.origin.z = 0.0;
  
  if( fabs( plane.xaxis.x ) > too_big )
    plane.xaxis.x = 1.0;
  if( fabs( plane.xaxis.y ) > too_big )
    plane.xaxis.y = 0.0;
  if( fabs( plane.xaxis.z ) > too_big )
    plane.xaxis.z = 0.0;
  
  if( fabs( plane.yaxis.x ) > too_big )
    plane.yaxis.x = 0.0;
  if( fabs( plane.yaxis.y ) > too_big )
    plane.yaxis.y = 1.0;
  if( fabs( plane.yaxis.z ) > too_big )
    plane.yaxis.z = 0.0;

  plane.xaxis.Unitize();
  plane.yaxis.Unitize();
  plane.zaxis = ON_CrossProduct(plane.xaxis,plane.yaxis);
  plane.zaxis.Unitize();
  plane.UpdateEquation();
}